

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidConvolutionNoBias(void)

{
  RepeatedField<long> *this;
  RepeatedField<unsigned_long> *this_00;
  RepeatedField<float> *this_01;
  uint uVar1;
  Rep *pRVar2;
  ulong uVar3;
  bool bVar4;
  FeatureType *pFVar5;
  long *plVar6;
  FeatureDescription *pFVar7;
  ArrayFeatureType *pAVar8;
  NeuralNetworkLayer *pNVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  void *pvVar11;
  LayerUnion this_02;
  unsigned_long *puVar12;
  ValidPadding *pVVar13;
  WeightParams *pWVar14;
  float *pfVar15;
  ostream *poVar16;
  undefined8 *puVar17;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar18;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_03;
  Arena *pAVar19;
  uint uVar20;
  int iVar21;
  Model m1;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar2 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00169cfd:
    pRVar18 = &(local_80.description_)->input_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar21 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar21) goto LAB_00169cfd;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar11 = pRVar2->elements[iVar21];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"input",puVar17);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  this = &pAVar8->shape_;
  uVar1 = (pAVar8->shape_).current_size_;
  if (uVar1 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 1);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar1] = 3;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar1] = 3;
  }
  uVar20 = uVar1 + 1;
  (pAVar8->shape_).current_size_ = uVar20;
  if (uVar20 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 2);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar20] = 100;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar20] = 100;
  }
  uVar20 = uVar1 + 2;
  (pAVar8->shape_).current_size_ = uVar20;
  if (uVar20 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 3);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar20] = 100;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar20] = 100;
  }
  this->current_size_ = uVar1 + 3;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar2 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00169eba:
    pRVar18 = &(local_80.description_)->output_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar21 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar21) goto LAB_00169eba;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar11 = pRVar2->elements[iVar21];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"probs",puVar17);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar19 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar19);
  }
  pRVar2 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00169fb4:
    this_03 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_80.Type_.pipeline_)->models_;
    pNVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                       ((this_03->super_RepeatedPtrFieldBase).arena_);
    pNVar9 = (NeuralNetworkLayer *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       ((RepeatedPtrFieldBase *)this_03,pNVar9);
  }
  else {
    iVar21 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar2->allocated_size <= iVar21) goto LAB_00169fb4;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar21 + 1;
    pNVar9 = (NeuralNetworkLayer *)pRVar2->elements[iVar21];
  }
  pRVar2 = (pNVar9->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00169fed:
    pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar9->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar9->input_).super_RepeatedPtrFieldBase,pbVar10);
  }
  else {
    iVar21 = (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar21) goto LAB_00169fed;
    (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar11 = pRVar2->elements[iVar21];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3a8ef3);
  pRVar2 = (pNVar9->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar21 = (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar21 < pRVar2->allocated_size) {
      (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
      pvVar11 = pRVar2->elements[iVar21];
      goto LAB_0016a058;
    }
  }
  pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar9->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar9->output_).super_RepeatedPtrFieldBase,pbVar10);
LAB_0016a058:
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3977ad);
  if (pNVar9->_oneof_case_[0] == 100) {
    this_02 = pNVar9->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar9);
    pNVar9->_oneof_case_[0] = 100;
    uVar3 = (pNVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    this_02.convolution_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ConvolutionLayerParams>
                   (pAVar19);
    (pNVar9->layer_).convolution_ = (ConvolutionLayerParams *)this_02;
  }
  (this_02.convolution_)->outputchannels_ = 5;
  (this_02.convolution_)->kernelchannels_ = 3;
  this_00 = &(this_02.convolution_)->kernelsize_;
  uVar1 = ((this_02.convolution_)->kernelsize_).current_size_;
  if (uVar1 == ((this_02.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar1 + 1);
    puVar12 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar12[uVar1] = 2;
  }
  else {
    puVar12 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar12[uVar1] = 2;
  }
  uVar20 = uVar1 + 1;
  ((this_02.convolution_)->kernelsize_).current_size_ = uVar20;
  if (uVar20 == ((this_02.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar1 + 2);
    puVar12 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar12[uVar20] = 5;
  }
  else {
    puVar12 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar12[uVar20] = 5;
  }
  ((this_02.convolution_)->kernelsize_).current_size_ = uVar1 + 2;
  (this_02.convolution_)->hasbias_ = true;
  if ((this_02.convolution_)->_oneof_case_[0] != 0x32) {
    CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType
              (this_02.convolution_);
    (this_02.convolution_)->_oneof_case_[0] = 0x32;
    uVar3 = ((this_02.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pVVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ValidPadding>
                        (pAVar19);
    ((this_02.convolution_)->ConvolutionPaddingType_).valid_ = pVVar13;
  }
  iVar21 = 0x96;
  do {
    pWVar14 = (this_02.convolution_)->weights_;
    if (pWVar14 == (WeightParams *)0x0) {
      uVar3 = ((this_02.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar19 = *(Arena **)pAVar19;
      }
      pWVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar19);
      (this_02.convolution_)->weights_ = pWVar14;
    }
    this_01 = &pWVar14->floatvalue_;
    uVar1 = (pWVar14->floatvalue_).current_size_;
    if (uVar1 == (pWVar14->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(this_01,uVar1 + 1);
      pfVar15 = google::protobuf::RepeatedField<float>::elements(this_01);
      pfVar15[uVar1] = 1.0;
    }
    else {
      pfVar15 = google::protobuf::RepeatedField<float>::elements(this_01);
      pfVar15[uVar1] = 1.0;
    }
    this_01->current_size_ = uVar1 + 1;
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar4 = CoreML::Result::good(&local_50);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5c9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)bVar4;
}

Assistant:

int testInvalidConvolutionNoBias() {

    Specification::Model m1;

    int output_channels = 5;
    int kernel_channels = 3;
    int kernel_height = 2;
    int kernel_width = 5;
    int nGroups = 1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);
    params->add_kernelsize(kernel_height);
    params->add_kernelsize(kernel_width);

    params->set_hasbias(true);

    (void)params->mutable_valid();

    for (int i = 0; i < output_channels * (kernel_channels / nGroups) * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Not specifying the right number of weights should be invalid

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}